

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueReader.hpp
# Opt level: O0

void __thiscall binlog::detail::QueueReader::endRead(QueueReader *this)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  memory_order __b;
  
  lVar1 = *in_RDI;
  lVar2 = in_RDI[1];
  std::operator&(memory_order_release,__memory_order_mask);
  *(long *)(lVar1 + 0x20) = lVar2;
  return;
}

Assistant:

void endRead()
  {
    _queue->readIndex.store(_readEnd, std::memory_order_release);
  }